

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  __int32_t **pp_Var7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  byte *pbVar14;
  size_t sVar15;
  byte bVar16;
  byte bVar17;
  byte local_194;
  uchar bom [3];
  FILE *local_188;
  char *value;
  size_t local_178;
  int local_170;
  int local_16c;
  long local_168;
  int local_15c;
  long local_158;
  char **local_150;
  char *local_148;
  char *local_140;
  char buf [256];
  
  if (argc == 1) {
LAB_00101345:
    show_help();
  }
  else {
    local_158 = 0x14;
    local_194 = 0x2c;
    local_170 = 0;
    local_15c = argc;
    local_150 = argv;
    for (iVar5 = 1; iVar5 < argc; iVar5 = iVar5 + 1) {
      pbVar14 = (byte *)argv[iVar5];
      bVar17 = *pbVar14;
      bVar4 = local_194;
      if ((bVar17 | 2) == 0x2f) {
        pp_Var7 = __ctype_tolower_loc();
        iVar6 = (*pp_Var7)[(char)pbVar14[1]];
        if (iVar6 == 100) {
          if (pbVar14[2] == 0) {
            iVar6 = iVar5 + 1;
            if ((argc <= iVar6) || (pbVar14 = (byte *)argv[iVar6], pbVar14 == (byte *)0x0))
            goto LAB_0010177a;
          }
          else {
            pbVar14 = pbVar14 + 2;
            iVar6 = iVar5;
          }
          iVar5 = iVar6;
          local_158 = strtol((char *)pbVar14,(char **)0x0,10);
        }
        else if (iVar6 == 0x73) {
          bVar4 = pbVar14[2];
          if (((pbVar14[2] == 0) && (iVar6 = iVar5 + 1, bVar4 = local_194, iVar6 < argc)) &&
             ((byte *)argv[iVar6] != (byte *)0x0)) {
            iVar5 = iVar6;
            bVar4 = *argv[iVar6];
          }
        }
        else {
          if (iVar6 != 0x74) {
            if ((iVar6 != 0x3f) && (iVar6 != 0x68)) {
              if ((bVar17 != 0x2d) || (pbVar14[1] != 0)) goto LAB_001013f0;
              local_188 = _stdin;
              pcVar8 = strdup("Sheet1");
              __dest = strdup("data.xlsx");
              goto LAB_001014a7;
            }
            goto LAB_00101345;
          }
          local_170 = 1;
        }
      }
      else {
LAB_001013f0:
        local_188 = fopen((char *)pbVar14,"rb");
        if (local_188 == (FILE *)0x0) {
          fprintf(_stderr,"Error opening file: %s\n",argv[iVar5]);
          local_188 = (FILE *)0x0;
          pcVar8 = (char *)0x0;
LAB_00101838:
          __dest = (char *)0x0;
        }
        else {
          pcVar8 = strdup(argv[iVar5]);
          if (pcVar8 != (char *)0x0) {
            pcVar9 = strrchr(pcVar8,0x2e);
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
            }
            sVar10 = strlen(pcVar8);
            uVar3 = sVar10 & 0xffffffff;
            do {
              uVar13 = uVar3;
              if ((int)uVar13 < 1) goto LAB_00101463;
              uVar3 = uVar13 - 1;
            } while (pcVar8[uVar13 - 1] != '/');
            memmove(pcVar8,pcVar8 + uVar13,sVar10 - (uVar13 - 1));
          }
LAB_00101463:
          pcVar9 = argv[iVar5];
          sVar10 = strlen(pcVar9);
          __dest = (char *)malloc(sVar10 + 6);
          if (__dest == (char *)0x0) {
            fwrite("Memory allocation error\n",0x18,1,_stderr);
            goto LAB_00101838;
          }
          strcpy(__dest,pcVar9);
          sVar10 = strlen(__dest);
          builtin_strncpy(__dest + sVar10,".xlsx",6);
        }
LAB_001014a7:
        if (((pcVar8 != (char *)0x0) && (local_188 != (FILE *)0x0)) && (__dest != (char *)0x0)) {
          lVar11 = xlsxiowrite_open(__dest);
          if (lVar11 != 0) {
            xlsxiowrite_set_detection_rows(lVar11,local_158);
            local_168 = lVar11;
            xlsxiowrite_set_row_height(lVar11,1);
            sVar10 = fread(bom,1,3,local_188);
            if (((sVar10 != 3) || (bom[0] != 0xef)) || ((bom[1] != 0xbb || (bom[2] != 0xbf)))) {
              fseek(local_188,0,0);
            }
            value = (char *)0x0;
            local_178 = 0;
            bVar17 = 0;
            bVar1 = true;
            local_16c = 1;
            local_148 = __dest;
            local_140 = pcVar8;
            while (sVar10 = fread(buf,1,0x100,local_188), sVar10 != 0) {
              lVar11 = 0;
              for (sVar15 = 0; pcVar8 = buf + lVar11, sVar10 != sVar15; sVar15 = sVar15 + 1) {
                bVar16 = buf[sVar15];
                if (bVar1) {
                  if (bVar16 == local_194 || bVar16 == 10) {
                    append_buffer_data(&value,&local_178,pcVar8,sVar15 - lVar11);
                    lVar2 = local_168;
                    if (local_178 == 0 || bVar16 != 10) {
                      sVar12 = local_178;
                      if (value != (char *)0x0) goto LAB_00101661;
                      pcVar8 = (char *)0x0;
                    }
                    else {
                      sVar12 = local_178 - (value[local_178 - 1] == '\r');
LAB_00101661:
                      value[sVar12] = '\0';
                      pcVar8 = value;
                    }
                    if (local_16c == 0 || local_170 == 0) {
                      xlsxiowrite_add_cell_string(local_168,pcVar8);
                    }
                    else {
                      xlsxiowrite_add_column(local_168,pcVar8,0);
                    }
                    lVar11 = sVar15 + 1;
                    free(pcVar8);
                    value = (char *)0x0;
                    local_178 = 0;
                    if (bVar16 == 10) {
                      xlsxiowrite_next_row(lVar2);
                      local_16c = 0;
                      bVar16 = 10;
                    }
                  }
                  else if (bVar16 == 0x22) {
                    append_buffer_data(&value,&local_178,pcVar8,
                                       ((ulong)(bVar17 == 0x22) - lVar11) + sVar15);
                    lVar11 = sVar15 + 1;
                    bVar16 = 0x22;
                    goto LAB_00101653;
                  }
LAB_001016c2:
                  bVar1 = true;
                }
                else {
                  if (bVar16 == 0x22) {
                    append_buffer_data(&value,&local_178,pcVar8,sVar15 - lVar11);
                    lVar11 = sVar15 + 1;
                    bVar16 = 0x22;
                    goto LAB_001016c2;
                  }
LAB_00101653:
                  bVar1 = false;
                }
                bVar17 = bVar16;
              }
              append_buffer_data(&value,&local_178,pcVar8,sVar10 - lVar11);
            }
            xlsxiowrite_close(local_168);
            free(value);
            pcVar8 = local_140;
            __dest = local_148;
            argv = local_150;
            argc = local_15c;
          }
          fclose(local_188);
        }
        free(__dest);
        free(pcVar8);
      }
LAB_0010177a:
      local_194 = bVar4;
    }
  }
  return 0;
}

Assistant:

int main (int argc, char* argv[])
{
  int i;
  char* param;
  FILE* src;
  char separator = ',';
  char quote = '"';
  int toprowheaders = 0;
  xlsxiowriter xlsxiowrite;
  char* sheetname;
  char* filename;
  size_t xlsxdetectionrows = DEFAULT_DETECTION_ROWS;
  //process command line parameters
  if (argc == 1) {
    show_help();
    return 0;
  }
  for (i = 1; i < argc; i++) {
    //check for command line parameters
    if (argv[i][0] && (argv[i][0] == '/' || argv[i][0] == '-')) {
      switch (tolower(argv[i][1])) {
        case 'h' :
        case '?' :
          show_help();
          return 0;
        case 's' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            separator = param[0];
          continue;
        case 'd' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            xlsxdetectionrows = strtol(param, (char**)NULL, 10);
          continue;
        case 't' :
          toprowheaders = 1;
          continue;
      }
    }
    //open CSV file
    sheetname = NULL;
    filename = NULL;
    src = NULL;
    if (strcmp(argv[i], "-") == 0) {
      src = stdin;
#ifdef _WIN32
      setmode(fileno(stdin), O_BINARY);
#endif
      sheetname = strdup("Sheet1");
      filename = strdup("data.xlsx");
    } else if ((src = fopen(argv[i], "rb")) == NULL) {
      fprintf(stderr, "Error opening file: %s\n", argv[i]);
    } else {
      //determine sheetname
      if ((sheetname = strdup(argv[i])) != NULL) {
        char* p;
        int i;
        //strip extension
        if ((p = strrchr(sheetname, '.')) != NULL)
          *p = 0;
        //strip path
        i = strlen(sheetname);
        while (i-- > 0) {
          if (sheetname[i] == '/'
#ifdef _WIN32
            || sheetname[i] == '\\'
#endif
          ) {
            memmove(sheetname, sheetname + i + 1, strlen(sheetname) - i);
            break;
          }
        }
      }
      //determine output filename
      if ((filename = (char*)malloc(strlen(argv[i]) + 6)) == NULL ){
        fprintf(stderr, "Memory allocation error\n");
      } else {
        strcpy(filename, argv[i]);
        strcat(filename, ".xlsx");
      }
    }
    if (src && filename && sheetname) {
      //create .xslx file
      if ((xlsxiowrite = xlsxiowrite_open(filename, sheetname)) != NULL) {
        xlsxiowrite_set_detection_rows(xlsxiowrite, xlsxdetectionrows);
        xlsxiowrite_set_row_height(xlsxiowrite, 1);
        //skip UTF-8 BOM header if present
        unsigned char bom[3];
        if (!(fread(bom, 1, 3, src) == 3 && bom[0] == 0xEF && bom[1] == 0xBB && bom[2] == 0xBF)) {
          fseek(src, 0, SEEK_SET);
        }
        //process CSV file
        char buf[BUFFER_SIZE];
        size_t buflen = 0;
        size_t bufstart = 0;
        size_t bufpos = 0;
        char* value = NULL;
        size_t valuelen = 0;
        size_t unquoted = 1;
        char lastchar = 0;
        int toprow = 1;
        //read data one buffer at a tome
        while ((buflen = fread(buf, 1, BUFFER_SIZE, src)) > 0) {
          //process each character in buffer
          while (bufpos < buflen) {
            if (unquoted) {
              if (buf[bufpos] == separator || buf[bufpos] == '\n') {
                //process end of cell
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
                bufstart = bufpos + 1;
                //detect CRLF line breaks and skip CR
                if (buf[bufpos] == '\n' && valuelen > 0 && value[valuelen - 1] == '\r')
                  valuelen--;
                //write cell value
                if (value)
                  value[valuelen] = 0;
                if (toprow && toprowheaders)
                  xlsxiowrite_add_column(xlsxiowrite, value, 0);
                else
                  xlsxiowrite_add_cell_string(xlsxiowrite, value);
                //clean up cell value
                free(value);
                value = NULL;
                valuelen = 0;
                //process end of line
                if (buf[bufpos] == '\n') {
                  xlsxiowrite_next_row(xlsxiowrite);
                  toprow = 0;
                }
              } else if (buf[bufpos] == quote) {
                //process upen quote
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart + (lastchar == quote ? 1 : 0));
                bufstart = bufpos + 1;
                unquoted = 0;
              }
            } else if (buf[bufpos] == quote) {
              //process close quote
              append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
              bufstart = bufpos + 1;
              unquoted = 1;
            }
            //prepare for processing next character
            lastchar = buf[bufpos];
            bufpos++;
          }
          //dump data at end of buffer and reset counters
          append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
          bufstart = 0;
          bufpos = 0;
        }
        //close .xlsx file
        xlsxiowrite_close(xlsxiowrite);
        //clean up
        free(value);
      }
      //close CSV file
      fclose(src);
    }
    //clean up
    free(filename);
    free(sheetname);
  }
  return 0;
}